

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::color_selector_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  void *local_38;
  color_selector_details *pDst;
  color_selector_details *pSrc_end;
  color_selector_details *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = pDst_void;
  for (pSrc_end = (color_selector_details *)pSrc_void;
      pSrc_end != (color_selector_details *)((long)pSrc_void + (ulong)num * 0x104);
      pSrc_end = pSrc_end + 1) {
    memcpy(local_38,pSrc_end,0x104);
    local_38 = (void *)((long)local_38 + 0x104);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }